

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

double GetDifficulty(CBlockIndex *blockindex)

{
  uint uVar1;
  uint uVar2;
  long in_FS_OFFSET;
  double dVar3;
  
  dVar3 = 65535.0 / (double)(blockindex->nBits & 0xffffff);
  uVar1 = blockindex->nBits >> 0x18;
  for (uVar2 = uVar1; uVar2 < 0x1d; uVar2 = uVar2 + 1) {
    dVar3 = dVar3 * 256.0;
  }
  uVar2 = 0x1d;
  if (0x1d < uVar1) {
    uVar2 = uVar1;
  }
  for (; 0x1d < (int)uVar2; uVar2 = uVar2 - 1) {
    dVar3 = dVar3 * 0.00390625;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return dVar3;
}

Assistant:

double GetDifficulty(const CBlockIndex& blockindex)
{
    int nShift = (blockindex.nBits >> 24) & 0xff;
    double dDiff =
        (double)0x0000ffff / (double)(blockindex.nBits & 0x00ffffff);

    while (nShift < 29)
    {
        dDiff *= 256.0;
        nShift++;
    }
    while (nShift > 29)
    {
        dDiff /= 256.0;
        nShift--;
    }

    return dDiff;
}